

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

timeval tvnow(void)

{
  timeval now;
  timeval local_18;
  
  gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
  return local_18;
}

Assistant:

static struct timeval tvnow(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  (void)gettimeofday(&now, NULL);
  return now;
}